

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

int walk_directory(CPUMIPSState_conflict2 *env,uint64_t *vaddr,int directory_index,_Bool *huge_page,
                  _Bool *hgpg_directory_hit,uint64_t *pw_entrylo0,uint64_t *pw_entrylo1)

{
  uint64_t *env_00;
  _Bool _Var1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  uint64_t uVar5;
  uint32_t local_b0;
  uint32_t local_ac;
  uint32_t local_a8;
  uint32_t local_a4;
  uint64_t vaddr2;
  int oddpagebit;
  uint64_t w;
  uint64_t lsb;
  int prot;
  uint64_t paddr;
  uint64_t entry;
  uint32_t leafentry_size;
  uint32_t direntry_size;
  int leaf_shift;
  int directory_shift;
  int native_shift;
  int ptew;
  int pf_ptew;
  int hugepg;
  int psn;
  int dph;
  uint64_t *pw_entrylo0_local;
  _Bool *hgpg_directory_hit_local;
  _Bool *huge_page_local;
  uint64_t *puStack_20;
  int directory_index_local;
  uint64_t *vaddr_local;
  CPUMIPSState_conflict2 *env_local;
  
  hugepg = env->CP0_PWCtl >> 7 & 1;
  pf_ptew = env->CP0_PWCtl & 0x3f;
  ptew = env->CP0_PWCtl >> 6 & 1;
  native_shift = env->CP0_PWField & 0x3f;
  directory_shift = env->CP0_PWSize & 0x3f;
  leaf_shift = 3;
  if ((env->CP0_PWSize >> 0x1e & 1) == 0) {
    leaf_shift = 2;
  }
  if ((uint)directory_shift < 2) {
    local_a8 = leaf_shift;
    if ((ptew != 0) && (directory_shift == 1)) {
      local_a8 = leaf_shift + 1;
    }
    local_a4 = local_a8;
  }
  else {
    local_a4 = 0xffffffff;
  }
  direntry_size = local_a4;
  if ((uint)directory_shift < 2) {
    local_b0 = leaf_shift;
    if (directory_shift == 1) {
      local_b0 = leaf_shift + 1;
    }
    local_ac = local_b0;
  }
  else {
    local_ac = 0xffffffff;
  }
  leafentry_size = local_ac;
  entry._4_4_ = 1 << ((char)local_a4 + 3U & 0x1f);
  entry._0_4_ = 1 << ((char)local_ac + 3U & 0x1f);
  uVar5 = *vaddr;
  _psn = pw_entrylo0;
  pw_entrylo0_local = (uint64_t *)hgpg_directory_hit;
  hgpg_directory_hit_local = huge_page;
  huge_page_local._4_4_ = directory_index;
  puStack_20 = vaddr;
  vaddr_local = (uint64_t *)env;
  iVar2 = cpu_mmu_index(env,false);
  iVar2 = get_physical_address
                    (env,(hwaddr *)&stack0xffffffffffffff88,(int *)((long)&lsb + 4),
                     (target_ulong_conflict)uVar5,0,0x20,iVar2);
  if (iVar2 == 0) {
    _Var1 = get_pte((CPUMIPSState_conflict2 *)vaddr_local,*puStack_20,entry._4_4_,&paddr);
    if (_Var1) {
      if (((paddr & 1L << ((byte)pf_ptew & 0x3f)) == 0) || (ptew == 0)) {
        *puStack_20 = paddr;
        env_local._4_4_ = 2;
      }
      else {
        *hgpg_directory_hit_local = true;
        *(undefined1 *)pw_entrylo0_local = 1;
        paddr = get_tlb_entry_layout
                          ((CPUMIPSState_conflict2 *)vaddr_local,paddr,(int)entry,native_shift);
        env_00 = vaddr_local;
        if ((huge_page_local._4_4_ & 1) == 0) {
          if (hugepg == 0) {
            return 0;
          }
          iVar2 = 1 << ((byte)leafentry_size & 0x1f);
          uVar4 = *puStack_20;
          if ((*puStack_20 & (long)iVar2) == 0) {
            *_psn = paddr;
          }
          else {
            *pw_entrylo1 = paddr;
          }
          iVar3 = cpu_mmu_index((CPUMIPSState_conflict2 *)vaddr_local,false);
          iVar3 = get_physical_address
                            ((CPUMIPSState_conflict2 *)env_00,(hwaddr *)&stack0xffffffffffffff88,
                             (int *)((long)&lsb + 4),(target_ulong_conflict)(uVar4 ^ (long)iVar2),0,
                             0x20,iVar3);
          if (iVar3 != 0) {
            return 0;
          }
          _Var1 = get_pte((CPUMIPSState_conflict2 *)vaddr_local,uVar4 ^ (long)iVar2,(int)entry,
                          &paddr);
          if (!_Var1) {
            return 0;
          }
          uVar5 = get_tlb_entry_layout
                            ((CPUMIPSState_conflict2 *)vaddr_local,paddr,(int)entry,native_shift);
          if ((*puStack_20 & (long)iVar2) == 0) {
            *pw_entrylo1 = uVar5;
          }
          else {
            *_psn = uVar5;
          }
        }
        else {
          uVar4 = (ulong)((1 << ((char)huge_page_local._4_4_ - 1U & 0x1f)) >> 6);
          *_psn = paddr & (uVar4 ^ 0xffffffffffffffff);
          *pw_entrylo1 = paddr | uVar4;
        }
        env_local._4_4_ = 1;
      }
    }
    else {
      env_local._4_4_ = 0;
    }
  }
  else {
    env_local._4_4_ = 0;
  }
  return env_local._4_4_;
}

Assistant:

static int walk_directory(CPUMIPSState *env, uint64_t *vaddr,
        int directory_index, bool *huge_page, bool *hgpg_directory_hit,
        uint64_t *pw_entrylo0, uint64_t *pw_entrylo1)
{
    int dph = (env->CP0_PWCtl >> CP0PC_DPH) & 0x1;
    int psn = (env->CP0_PWCtl >> CP0PC_PSN) & 0x3F;
    int hugepg = (env->CP0_PWCtl >> CP0PC_HUGEPG) & 0x1;
    int pf_ptew = (env->CP0_PWField >> CP0PF_PTEW) & 0x3F;
    int ptew = (env->CP0_PWSize >> CP0PS_PTEW) & 0x3F;
    int native_shift = (((env->CP0_PWSize >> CP0PS_PS) & 1) == 0) ? 2 : 3;
    int directory_shift = (ptew > 1) ? -1 :
            (hugepg && (ptew == 1)) ? native_shift + 1 : native_shift;
    int leaf_shift = (ptew > 1) ? -1 :
            (ptew == 1) ? native_shift + 1 : native_shift;
    uint32_t direntry_size = 1 << (directory_shift + 3);
    uint32_t leafentry_size = 1 << (leaf_shift + 3);
    uint64_t entry;
    uint64_t paddr;
    int prot;
    uint64_t lsb = 0;
    uint64_t w = 0;

    if (get_physical_address(env, &paddr, &prot, *vaddr, MMU_DATA_LOAD,
                             ACCESS_INT, cpu_mmu_index(env, false)) !=
                             TLBRET_MATCH) {
        /* wrong base address */
        return 0;
    }
    if (!get_pte(env, *vaddr, direntry_size, &entry)) {
        return 0;
    }

    if ((entry & (1ULL << psn)) && hugepg) {
        *huge_page = true;
        *hgpg_directory_hit = true;
        entry = get_tlb_entry_layout(env, entry, leafentry_size, pf_ptew);
        w = directory_index - 1;
        if (directory_index & 0x1) {
            /* Generate adjacent page from same PTE for odd TLB page */
            lsb = (1 << w) >> 6;
            *pw_entrylo0 = entry & ~lsb; /* even page */
            *pw_entrylo1 = entry | lsb; /* odd page */
        } else if (dph) {
            int oddpagebit = 1 << leaf_shift;
            uint64_t vaddr2 = *vaddr ^ oddpagebit;
            if (*vaddr & oddpagebit) {
                *pw_entrylo1 = entry;
            } else {
                *pw_entrylo0 = entry;
            }
            if (get_physical_address(env, &paddr, &prot, vaddr2, MMU_DATA_LOAD,
                                     ACCESS_INT, cpu_mmu_index(env, false)) !=
                                     TLBRET_MATCH) {
                return 0;
            }
            if (!get_pte(env, vaddr2, leafentry_size, &entry)) {
                return 0;
            }
            entry = get_tlb_entry_layout(env, entry, leafentry_size, pf_ptew);
            if (*vaddr & oddpagebit) {
                *pw_entrylo0 = entry;
            } else {
                *pw_entrylo1 = entry;
            }
        } else {
            return 0;
        }
        return 1;
    } else {
        *vaddr = entry;
        return 2;
    }
}